

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O2

void __thiscall Code_generator::visit(Code_generator *this,Inst_msr *s)

{
  Register *pRVar1;
  uint uVar2;
  allocator local_39;
  string local_38;
  
  ast::Instruction::check_alignment(&s->super_Instruction);
  pRVar1 = s->rd;
  uVar2 = pRVar1->n;
  if ((uVar2 & 0xfffffffe) != 0x12e) {
    std::__cxx11::string::string((string *)&local_38,"Invalid register",&local_39);
    error_report(&pRVar1->location,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    uVar2 = s->rd->n;
  }
  ast::Sections::write16
            ((s->super_Instruction).super_Statement.section_index,
             (s->super_Instruction).super_Statement.section_offset,
             (ushort)(s->rs->n << 7) | (ushort)(uVar2 == 0x12f) << 4 | 0xb040);
  return;
}

Assistant:

void Code_generator::visit(Inst_msr *s)
{
	s->check_alignment();
	if (s->rd->n != CPSR && s->rd->n != SPSR)
		error_report(&s->rd->location, "Invalid register");
	Sections::write16(s->section_index, s->section_offset,
		static_cast<uint16_t>(MSR_OPCODE 
			| ((s->rd->n == SPSR) << SPSR_INDICATION_POSITION)
			| (s->rs->n << MOV_RS_POSITION)));
}